

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O3

uint32_t longest_match_slow_c(deflate_state *s,Pos cur_match)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  Pos *pPVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ushort uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uchar *local_a8;
  uint local_9c;
  ulong local_60;
  ulong local_38;
  
  uVar14 = (ulong)cur_match;
  uVar2 = s->strstart;
  uVar16 = (ulong)uVar2;
  uVar3 = s->w_mask;
  puVar4 = s->window;
  uVar15 = 2;
  if (s->prev_length != 0) {
    uVar15 = s->prev_length;
  }
  uVar19 = 0xffffffff;
  if (3 < uVar15) {
    uVar19 = (uint)(uVar15 < 8) << 2 | 0xfffffff9;
  }
  local_60 = *(ulong *)(puVar4 + (uVar19 + uVar15) + uVar16);
  local_a8 = puVar4 + (uVar19 + uVar15);
  uVar19 = s->lookahead;
  uVar26 = s->max_chain_length >> 2;
  if (uVar15 < s->good_match) {
    uVar26 = s->max_chain_length;
  }
  uVar8 = s->w_size - 0x106;
  uVar18 = 0;
  uVar13 = uVar2 - uVar8;
  if (uVar2 < uVar8 || uVar13 == 0) {
    uVar13 = 0;
  }
  pPVar5 = s->prev;
  lVar6 = *(long *)(puVar4 + uVar16);
  uVar8 = s->nice_match;
  puVar12 = puVar4;
  uVar20 = uVar13;
  if (2 < uVar15) {
    uVar18 = 0;
    uVar9 = (*s->update_hash)(0,(uint)((ulong)lVar6 >> 8) & 0xff);
    uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar4[uVar16 + 2]);
    uVar22 = 3;
    do {
      uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar4[uVar22 + uVar16]);
      if (s->head[uVar9] < (ushort)uVar14) {
        uVar18 = (ulong)((int)uVar22 - 2);
        uVar14 = (ulong)s->head[uVar9];
      }
      uVar20 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar20;
    } while (uVar20 <= uVar15);
    uVar20 = (int)uVar18 + uVar13;
    if ((ushort)uVar14 <= (ushort)uVar20) {
LAB_00105026:
      if (s->lookahead <= uVar15) {
        return s->lookahead;
      }
      return uVar15;
    }
    local_a8 = local_a8 + -(uVar18 & 0xffff);
    puVar12 = puVar4 + -(uVar18 & 0xffff);
  }
  if (uVar2 <= (uint)uVar14) {
    return uVar15;
  }
  local_9c = (uint)(local_60 >> 0x10) & 0xffff;
  local_38 = local_60 >> 0x20;
  uVar22 = (ulong)uVar15;
LAB_00104cf8:
  uVar10 = uVar22 & 0xffffffff;
  uVar25 = (uint)uVar22;
  uVar17 = (ushort)uVar20;
  if (uVar25 < 4) {
    while( true ) {
      uVar24 = (uint)uVar14;
      uVar22 = uVar14 & 0xffff;
      if ((*(ushort *)(local_a8 + uVar22) == (ushort)local_60) &&
         (*(short *)(puVar12 + uVar22) == (short)lVar6)) break;
      if (uVar26 == 1) {
        return uVar25;
      }
      uVar14 = (ulong)pPVar5[(uint)uVar22 & uVar3];
      uVar26 = uVar26 - 1;
      if (pPVar5[(uint)uVar22 & uVar3] <= uVar17) {
        return uVar25;
      }
    }
  }
  else if (uVar25 < 8) {
    while( true ) {
      uVar24 = (uint)uVar14;
      uVar22 = uVar14 & 0xffff;
      if ((*(uint *)(local_a8 + uVar22) == (local_9c << 0x10 | (uint)(ushort)local_60)) &&
         (*(int *)(puVar12 + uVar22) == (int)lVar6)) break;
      if (uVar26 == 1) {
        return uVar25;
      }
      uVar14 = (ulong)pPVar5[(uint)uVar22 & uVar3];
      uVar26 = uVar26 - 1;
      if (pPVar5[(uint)uVar22 & uVar3] <= uVar17) {
        return uVar25;
      }
    }
  }
  else {
    while( true ) {
      uVar24 = (uint)uVar14;
      uVar22 = uVar14 & 0xffff;
      if ((*(ulong *)(local_a8 + uVar22) ==
           (local_38 << 0x20 | local_60 & 0xffff | (ulong)(local_9c << 0x10))) &&
         (*(long *)(puVar12 + uVar22) == lVar6)) break;
      if (uVar26 == 1) {
        return uVar25;
      }
      uVar14 = (ulong)pPVar5[(uint)uVar22 & uVar3];
      uVar26 = uVar26 - 1;
      if (pPVar5[(uint)uVar22 & uVar3] <= uVar17) {
        return uVar25;
      }
    }
  }
  lVar23 = 0;
LAB_00104e06:
  uVar21 = (uint)lVar23;
  if (*(ulong *)(puVar4 + lVar23 + uVar16 + 2) == *(ulong *)(puVar12 + lVar23 + uVar22 + 2))
  goto code_r0x00104e14;
  uVar22 = *(ulong *)(puVar12 + lVar23 + uVar22 + 2) ^ *(ulong *)(puVar4 + lVar23 + uVar16 + 2);
  uVar14 = 0;
  if (uVar22 != 0) {
    for (; (uVar22 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
    }
  }
  uVar21 = uVar21 + ((uint)(uVar14 >> 3) & 0x1fffffff);
  goto LAB_00104e39;
code_r0x00104e14:
  lVar23 = lVar23 + 8;
  if (0xf7 < uVar21) goto code_r0x00104e24;
  goto LAB_00104e06;
code_r0x00104e24:
  uVar21 = 0x100;
LAB_00104e39:
  uVar22 = (ulong)uVar21 + 2;
  uVar15 = (uint)uVar22;
  if (uVar25 < uVar15) {
    uVar25 = (uVar24 & 0xffff) - ((uint)uVar18 & 0xffff);
    uVar14 = (ulong)uVar25;
    s->match_start = uVar25;
    if (uVar19 < uVar15) {
      return uVar19;
    }
    if (uVar8 <= uVar15) {
      return uVar15;
    }
    uVar1 = uVar21 - 5;
    if (uVar21 < 6) {
      uVar1 = uVar21 - 1;
    }
    if (uVar21 < 2) {
      uVar1 = uVar21 + 1;
    }
    uVar10 = (ulong)uVar1;
    local_60 = *(ulong *)(puVar4 + uVar10 + uVar16);
    local_9c = (uint)(local_60 >> 0x10) & 0xffff;
    local_38 = local_60 >> 0x20;
    if ((1 < uVar21) && (uVar15 + uVar25 < uVar2)) {
      uVar11 = 0;
      uVar18 = 0;
      do {
        iVar7 = (int)uVar11;
        uVar17 = pPVar5[(uVar25 & 0xffff) + iVar7 & uVar3];
        if (uVar17 < (ushort)uVar14) {
          if ((uint)uVar17 <= (uVar13 & 0xffff) + iVar7) goto LAB_00105026;
          uVar14 = (ulong)uVar17;
          uVar18 = uVar11;
        }
        uVar11 = (ulong)(iVar7 + 1U);
      } while (iVar7 + 1U <= uVar21 - 1);
      uVar9 = (*s->update_hash)(0,(uint32_t)puVar4[uVar22 + (uVar16 - 4)]);
      uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar4[uVar22 + (uVar16 - 3)]);
      uVar9 = (*s->update_hash)(uVar9,(uint32_t)puVar4[uVar22 + (uVar16 - 2)]);
      uVar17 = s->head[uVar9];
      if (uVar17 < (ushort)uVar14) {
        uVar18 = (ulong)(uVar21 - 2);
        uVar14 = (ulong)uVar17;
        if ((uint)uVar17 <= (uVar21 - 2 & 0xffff) + (uVar13 & 0xffff)) goto LAB_00105026;
      }
      uVar20 = (int)uVar18 + uVar13;
      puVar12 = puVar4 + -(uVar18 & 0xffff);
      local_a8 = puVar12 + uVar10;
      goto LAB_00104f09;
    }
    local_a8 = puVar12 + uVar10;
    uVar10 = uVar22;
  }
  uVar26 = uVar26 - 1;
  if (uVar26 == 0) {
    return (uint32_t)uVar10;
  }
  uVar14 = (ulong)pPVar5[uVar24 & 0xffff & uVar3];
  uVar22 = uVar10 & 0xffffffff;
  if (pPVar5[uVar24 & 0xffff & uVar3] <= uVar17) {
    return (uint32_t)uVar10;
  }
LAB_00104f09:
  if (uVar2 <= ((uint)uVar14 & 0xffff)) {
    return (uint32_t)uVar22;
  }
  goto LAB_00104cf8;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}